

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

GLint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest10::testDraw(FunctionalTest10 *this,GLuint *routine_indices)

{
  GLint GVar1;
  GLuint i;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  GLint *pGVar6;
  GLuint subroutine_indices [16];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    subroutine_indices[this->m_subroutine_uniform_locations[lVar5]] =
         this->m_subroutine_indices[routine_indices[lVar5]];
  }
  (**(code **)(lVar4 + 0x1668))(0x8b31,0x10,subroutine_indices);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14d9);
  (**(code **)(lVar4 + 0x30))(0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14dd);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14e0);
  (**(code **)(lVar4 + 0x638))();
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14e3);
  pGVar6 = (GLint *)(**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14e7);
  GVar1 = *pGVar6;
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x14ed);
  return GVar1;
}

Assistant:

GLint FunctionalTest10::testDraw(const GLuint routine_indices[16]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLuint				  subroutine_indices[16];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[routine_indices[i]];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLint* feedback_data = (GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	GLint result = feedback_data[0];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	return result;
}